

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::
AddToQueue<int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char_data **args_1,int *args_2,int *args_3,int *args_4,int *args_5,
          int *args_6,char (*args_7) [18])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  string *local_150;
  CQueue *local_148;
  _func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_140;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_120 [40];
  string local_f8 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_d8;
  function<void()> local_c0 [32];
  tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]> tuple;
  undefined1 local_70 [24];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined2 local_34;
  
  nTimer_local = nTimer;
  local_150 = funcName;
  local_140 = func;
  if (nTimer < 0) {
    local_120._0_8_ = 8;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_120);
  }
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>.super__Tuple_impl<7UL,_const_char_(&)[18]>.
  super__Head_base<7UL,_const_char_(&)[18],_false>._M_head_impl =
       (_Head_base<7UL,_const_char_(&)[18],_false>)
       (_Head_base<7UL,_const_char_(&)[18],_false>)args_7;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>.super__Head_base<6UL,_int,_false>._M_head_impl =
       *args_6;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>._12_4_ = *args_5;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.super__Head_base<4UL,_int,_false>.
  _M_head_impl = *args_4;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>._20_4_ = *args_3;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<2UL,_int_&,_false>._M_head_impl = args_2;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<1UL,_char_data_*&,_false>._M_head_impl = args_1;
  local_148 = this;
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>(&chs,this,&tuple)
  ;
  local_120._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_120 + 8),(string *)from);
  std::__cxx11::string::string(local_f8,(string *)local_150);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_d8,&chs);
  local_70._0_8_ = local_140;
  local_70._8_8_ = *args;
  local_70._16_8_ = *args_1;
  local_58 = *args_2;
  local_54 = *args_3;
  local_50 = *args_4;
  local_4c = *args_5;
  local_48 = *args_6;
  local_44._0_1_ = *(char *)((long)args_7 + 0);
  local_44._1_1_ = *(char *)((long)args_7 + 1);
  local_44._2_1_ = *(char *)((long)args_7 + 2);
  local_44._3_1_ = *(char *)((long)args_7 + 3);
  local_44._4_1_ = *(char *)((long)args_7 + 4);
  local_44._5_1_ = *(char *)((long)args_7 + 5);
  local_44._6_1_ = *(char *)((long)args_7 + 6);
  local_44._7_1_ = *(char *)((long)args_7 + 7);
  uStack_3c._0_1_ = *(char *)((long)args_7 + 8);
  uStack_3c._1_1_ = *(char *)((long)args_7 + 9);
  uStack_3c._2_1_ = *(char *)((long)args_7 + 10);
  uStack_3c._3_1_ = *(char *)((long)args_7 + 0xb);
  uStack_3c._4_1_ = *(char *)((long)args_7 + 0xc);
  uStack_3c._5_1_ = *(char *)((long)args_7 + 0xd);
  uStack_3c._6_1_ = *(char *)((long)args_7 + 0xe);
  uStack_3c._7_1_ = *(char *)((long)args_7 + 0xf);
  local_34._0_1_ = *(char *)((long)args_7 + 0x10);
  local_34._1_1_ = *(char *)((long)args_7 + 0x11);
  std::function<void()>::
  function<CQueue::AddToQueue<int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>(int,std::__cxx11::string,std::__cxx11::string,int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int&&,int&&,int&&,int&&,char_const(&)[18])::_lambda()_1_,void>
            (local_c0,(anon_class_64_9_5b8487c2 *)local_70);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&local_148->newQueue,(queueEntry_t *)local_120);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_120);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_150,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}